

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_wrapper.h
# Opt level: O0

void __thiscall MeCab::ostream_wrapper::ostream_wrapper(ostream_wrapper *this,char *filename)

{
  int iVar1;
  void *this_00;
  char *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ostream_wrapper_001c6568;
  in_RDI[1] = 0;
  iVar1 = strcmp(in_RSI,"-");
  if (iVar1 == 0) {
    in_RDI[1] = &std::cout;
  }
  else {
    this_00 = operator_new(0x200);
    std::ofstream::ofstream(this_00,in_RSI,_S_out);
    in_RDI[1] = this_00;
  }
  return;
}

Assistant:

explicit ostream_wrapper(const char* filename): os_(0) {
    if (std::strcmp(filename, "-") == 0) {
      os_ = &std::cout;
    } else {
      os_ = new std::ofstream(WPATH(filename));
    }
  }